

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O0

void __thiscall Test::Test(Test *this)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar1;
  int local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  int local_3c;
  _Base_ptr local_38;
  undefined1 local_30;
  int local_14;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mVisitedMethods);
  local_14 = 0;
  pVar1 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::emplace<char_const(&)[4],int>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)this,(char (*) [4])"foo",&local_14);
  local_38 = (_Base_ptr)pVar1.first._M_node;
  local_30 = pVar1.second;
  local_3c = 0;
  pVar1 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::emplace<char_const(&)[7],int>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)this,(char (*) [7])"getSum",&local_3c);
  local_50 = (_Base_ptr)pVar1.first._M_node;
  local_48 = pVar1.second;
  local_54 = 0;
  std::
  map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::emplace<char_const(&)[4],int>
            ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)this,(char (*) [4])"max",&local_54);
  return;
}

Assistant:

Test()
  {
    mVisitedMethods.emplace("foo", 0);
    mVisitedMethods.emplace("getSum", 0);
    mVisitedMethods.emplace("max", 0);
  }